

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

bool ON_CRT_LOCALE::ValidateString(char *buffer,size_t sizeof_buffer,int printf_rc)

{
  long lVar1;
  
  if ((((printf_rc == 0x11) && (0x11 < sizeof_buffer)) && (sizeof_buffer != 0)) &&
     ((buffer != (char *)0x0 && (m_validation_string != (char *)0x0)))) {
    for (lVar1 = 0; (lVar1 != 0x12 && (buffer[lVar1] == m_validation_string[lVar1]));
        lVar1 = lVar1 + 1) {
      if (buffer[lVar1] == '\0') {
        return lVar1 == 0x11;
      }
    }
  }
  return false;
}

Assistant:

static bool ValidateString(
    const char* buffer,
    size_t sizeof_buffer,
    int printf_rc
    )
  {
    bool rc = false;

    if (0 == buffer
      || printf_rc <= 0
      || sizeof_buffer <= 0
      || 0 == m_validation_string
      || m_validation_length <= 0
      || m_validation_length >= sizeof_buffer
      || m_validation_length != (size_t)printf_rc
      )
    {
      rc = (0 == buffer && 0 == sizeof_buffer && 0 == m_validation_string && 0 == m_validation_length && 0 == printf_rc);
    }
    else
    {
      for (size_t i = 0; i < sizeof_buffer; i++)
      {
        if (i > m_validation_length)
          break;
        if (buffer[i] != m_validation_string[i])
          break;
        if (0 == m_validation_string[i])
        {
          rc = (i == m_validation_length);
          break;
        }
      }
    }

    return rc;
  }